

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AppendDependencyInfoLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *linkLanguage)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  depFlags;
  string depFile;
  string depFlag;
  RuleVariables linkDepsVariables;
  cmRulePlaceholderExpander *local_210;
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1a8;
  string *local_190;
  RuleVariables local_188;
  
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x35])();
  if ((char)iVar3 != '\0') {
    bVar2 = cmGeneratorTarget::HasLinkDependencyFile(target,config);
    if (bVar2) {
      this_00 = this->Makefile;
      local_188.CMTargetName = (char *)0x6;
      local_188.CMTargetType = "CMAKE_";
      local_188.TargetPDB = (char *)0x0;
      local_188.TargetVersionMajor = (linkLanguage->_M_dataplus)._M_p;
      local_188.TargetCompilePDB = (char *)linkLanguage->_M_string_length;
      local_188.TargetVersionMinor = (char *)0x0;
      local_188.Language = (char *)0x15;
      local_188.AIXExports = "_LINKER_DEPFILE_FLAGS";
      local_188.Objects = (char *)0x0;
      views._M_len = 3;
      views._M_array = (iterator)&local_188;
      local_190 = flags;
      cmCatViews((string *)&local_1e8,views);
      psVar4 = (string *)cmMakefile::GetDefinition(this_00,(string *)&local_1e8);
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar1,pcVar1 + psVar4->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_allocated_capacity != &local_1d8) {
        operator_delete((void *)local_1e8._M_allocated_capacity,local_1d8._M_allocated_capacity + 1)
        ;
      }
      if (local_1c8._M_string_length != 0) {
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0xb])
                  (local_208,this,target,config);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[2])(&local_188,this,local_208);
        source._M_str = local_188.CMTargetName;
        source._M_len = (size_t)local_188.CMTargetType;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)&local_1e8,&this->super_cmOutputConverter,source,SHELL,false);
        if ((char **)local_188.CMTargetName != &local_188.TargetPDB) {
          operator_delete(local_188.CMTargetName,(ulong)(local_188.TargetPDB + 1));
        }
        if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
          operator_delete((void *)local_208._0_8_,
                          (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_208._16_8_)->_M_dataplus)._M_p + 1));
        }
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[6])(&local_210);
        memset(&local_188,0,0x158);
        local_188.DependencyFile = (char *)local_1e8._M_allocated_capacity;
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_210,&this->super_cmOutputConverter,&local_1c8,&local_188);
        local_1a8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_1a8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1a8);
        cmExpandListWithBacktrace
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_208,&local_1c8,(cmListFileBacktrace *)&local_1a8,No);
        if (local_1a8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        cmGeneratorTarget::ResolveLinkerWrapper
                  (target,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_208,linkLanguage,false);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[8])(this,local_190,local_208);
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_208);
        if (local_210 != (cmRulePlaceholderExpander *)0x0) {
          (*(local_210->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_allocated_capacity != &local_1d8) {
          operator_delete((void *)local_1e8._M_allocated_capacity,
                          local_1d8._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendDependencyInfoLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& linkLanguage)
{
  if (!this->GetGlobalGenerator()->SupportsLinkerDependencyFile() ||
      !target->HasLinkDependencyFile(config)) {
    return;
  }

  auto depFlag = *this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_LINKER_DEPFILE_FLAGS"));
  if (depFlag.empty()) {
    return;
  }

  auto depFile = this->ConvertToOutputFormat(
    this->MaybeRelativeToWorkDir(this->GetLinkDependencyFile(target, config)),
    cmOutputConverter::SHELL);
  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();
  cmRulePlaceholderExpander::RuleVariables linkDepsVariables;
  linkDepsVariables.DependencyFile = depFile.c_str();
  rulePlaceholderExpander->ExpandRuleVariables(this, depFlag,
                                               linkDepsVariables);
  auto depFlags = cmExpandListWithBacktrace(depFlag);
  target->ResolveLinkerWrapper(depFlags, linkLanguage);

  this->AppendFlags(flags, depFlags);
}